

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

void __thiscall CNet::Refine(CNet *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CObject *this_00;
  longlong lVar4;
  pointer ppVar5;
  reference ppCVar6;
  int *piVar7;
  size_type sVar8;
  iterator iVar9;
  int local_1ac;
  ulong local_f0;
  longlong E;
  longlong S;
  CWire *pWire_1;
  CWire **local_d0;
  ulong local_c8;
  longlong P;
  _Hashtable *local_b8;
  iterator local_b0;
  ulong local_a0;
  int local_94;
  ulong uStack_90;
  int i;
  ulong local_88;
  CWire *local_80;
  CWire *pWire;
  CWire **local_70;
  __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_> local_68;
  iterator end;
  iterator itr;
  undefined1 local_48 [8];
  iterator itrp;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  RedPoint;
  CNet *this_local;
  
  iVar2 = IsLocal(this);
  if ((iVar2 == 0) && (iVar2 = IsRouted(this), iVar2 != 0)) {
    SplitWire(this);
    __gnu_cxx::
    hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
    ::hash_map((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                *)&itrp._M_ht);
    __gnu_cxx::
    _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
    ::_Hashtable_iterator
              ((_Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                *)local_48);
    __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
    __normal_iterator(&end);
    __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
    __normal_iterator(&local_68);
    local_70 = (CWire **)std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
    end._M_current = local_70;
    pWire = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
    local_68._M_current = (CWire **)pWire;
    while (bVar1 = __gnu_cxx::operator!=(&end,&local_68), bVar1) {
      ppCVar6 = __gnu_cxx::
                __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                operator*(&end);
      local_80 = *ppCVar6;
      lVar4 = CObject::GetKey(&local_80->m_pPointS->super_CObject);
      local_88 = (ulong)((uint)lVar4 & 0xffffff00);
      piVar7 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator[]((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                             *)&itrp._M_ht,(key_type *)&local_88);
      *piVar7 = *piVar7 + 1;
      lVar4 = CObject::GetKey(&local_80->m_pPointE->super_CObject);
      uStack_90 = (ulong)((uint)lVar4 & 0xffffff00);
      piVar7 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator[]((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                             *)&itrp._M_ht,(key_type *)&stack0xffffffffffffff70);
      *piVar7 = *piVar7 + 1;
      __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
      operator++(&end);
    }
    for (local_94 = 0; iVar2 = local_94, iVar3 = GetNumPin(this), iVar2 < iVar3;
        local_94 = local_94 + 1) {
      this_00 = (CObject *)GetPin(this,local_94);
      lVar4 = CObject::GetKey(this_00);
      local_a0 = (ulong)((uint)lVar4 & 0xffffff00);
      __gnu_cxx::
      hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
      ::erase((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               *)&itrp._M_ht,(key_type *)&local_a0);
    }
    local_b0 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::begin((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                        *)&itrp._M_ht);
    iVar9 = local_b0;
    while( true ) {
      itrp._M_cur = (_Node *)iVar9._M_ht;
      local_48 = (undefined1  [8])iVar9._M_cur;
      iVar9 = __gnu_cxx::
              hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
              ::end((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                     *)&itrp._M_ht);
      local_b8 = iVar9._M_ht;
      P = (longlong)iVar9._M_cur;
      bVar1 = __gnu_cxx::
              _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
              ::operator!=((_Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                            *)local_48,(iterator *)&P);
      if (!bVar1) break;
      ppVar5 = __gnu_cxx::
               _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator->((_Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                             *)local_48);
      if (ppVar5->second == 1) {
        ppVar5 = __gnu_cxx::
                 _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::operator->((_Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                               *)local_48);
        local_c8 = ppVar5->first;
        local_d0 = (CWire **)std::vector<CWire_*,_std::allocator<CWire_*>_>::begin(&this->m_Wire);
        end._M_current = local_d0;
        pWire_1 = (CWire *)std::vector<CWire_*,_std::allocator<CWire_*>_>::end(&this->m_Wire);
        local_68._M_current = (CWire **)pWire_1;
        while( true ) {
          bVar1 = __gnu_cxx::operator!=(&end,&local_68);
          if (!bVar1) break;
          ppCVar6 = __gnu_cxx::
                    __normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
                    operator*(&end);
          S = (longlong)*ppCVar6;
          lVar4 = CObject::GetKey(&((CWire *)S)->m_pPointS->super_CObject);
          E = (longlong)((uint)lVar4 & 0xffffff00);
          local_f0 = CObject::GetKey(*(CObject **)(S + 0x40));
          local_f0 = local_f0 & 0xffffff00;
          if ((local_c8 == E) || (local_c8 == local_f0)) {
            DelWire(this,(CWire *)S,0);
            CWire::Delete((CWire *)S);
            piVar7 = __gnu_cxx::
                     hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                     ::operator[]((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                                   *)&itrp._M_ht,&E);
            *piVar7 = *piVar7 + -1;
            piVar7 = __gnu_cxx::
                     hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                     ::operator[]((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                                   *)&itrp._M_ht,(key_type *)&local_f0);
            *piVar7 = *piVar7 + -1;
            break;
          }
          __gnu_cxx::__normal_iterator<CWire_**,_std::vector<CWire_*,_std::allocator<CWire_*>_>_>::
          operator++(&end);
        }
        iVar9 = __gnu_cxx::
                hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                ::begin((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                         *)&itrp._M_ht);
      }
      else {
        __gnu_cxx::
        _Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
        ::operator++((_Hashtable_iterator<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                      *)local_48);
        iVar9._M_ht = (_Hashtable *)itrp._M_cur;
        iVar9._M_cur = (_Node *)local_48;
      }
    }
    iVar2 = this->m_iMinWL;
    iVar3 = GetLength(this,1,1);
    if (iVar2 < iVar3) {
      local_1ac = this->m_iMinWL;
    }
    else {
      local_1ac = GetLength(this,1,1);
    }
    this->m_iMinWL = local_1ac;
    sVar8 = std::vector<CWire_*,_std::allocator<CWire_*>_>::size(&this->m_Wire);
    if (sVar8 == 0) {
      __assert_fail("m_Wire.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x200,"void CNet::Refine()");
    }
    __gnu_cxx::
    hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
    ::~hash_map((hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                 *)&itrp._M_ht);
  }
  return;
}

Assistant:

void CNet::Refine()
{
	if(IsLocal())	return;
	if(!IsRouted())	return;

	SplitWire();

	hash_map<KEY, int>				RedPoint;
	hash_map<KEY, int>::iterator		itrp;

	vector<CWire*>::iterator itr,end;
	for(itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	{
		CWire*	pWire	=	*itr;

		++RedPoint[pWire->m_pPointS->GetKey()&0xFFFFFF00];
		++RedPoint[pWire->m_pPointE->GetKey()&0xFFFFFF00];
	}

	for(int i=0;i<GetNumPin();++i)
		RedPoint.erase(GetPin(i)->GetKey()&0xFFFFFF00);

	for(itrp=RedPoint.begin();itrp!=RedPoint.end();)
	{
		if(itrp->second==1)	// dangling point [7/5/2006 thyeros]
		{
			KEY	P	=	itrp->first;
	
			for(itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
			{
				CWire*	pWire	=	*itr;

				KEY S	=	pWire->m_pPointS->GetKey()&0xFFFFFF00;
				KEY	E	=	pWire->m_pPointE->GetKey()&0xFFFFFF00;

				if(P==S||P==E)
				{
					DelWire(pWire);
					pWire->Delete();//SAFE_DEL(pWire);

					--RedPoint[S];
					--RedPoint[E];

					break;
				}
			}

			itrp=RedPoint.begin();
		}
		else
		{
			++itrp;
		}
	}

	m_iMinWL	=	MIN(m_iMinWL,GetLength(GET_MODE_STATE,STATE_WIRE_ROUTED));
//	m_iMinVia	=	MIN(m_iMinVia,GetNumVia());

	assert(m_Wire.size());
}